

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

ProString * __thiscall ProString::append(ProString *this,ProString *other,bool *pending)

{
  storage_type_conflict *psVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  undefined1 local_48 [16];
  storage_type_conflict *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (other->m_length == 0) goto LAB_00109b05;
  if ((long)this->m_length == 0) {
    operator=(this,other);
  }
  else {
    if ((this->m_string).d.size != (long)this->m_length) {
      toQString((QString *)local_48,this);
      pDVar2 = (this->m_string).d.d;
      pcVar3 = (this->m_string).d.ptr;
      (this->m_string).d.d = (Data *)local_48._0_8_;
      (this->m_string).d.ptr = (char16_t *)local_48._8_8_;
      psVar1 = (storage_type_conflict *)(this->m_string).d.size;
      (this->m_string).d.size = (qsizetype)local_38;
      local_48._0_8_ = pDVar2;
      local_48._8_8_ = pcVar3;
      local_38 = psVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_48);
    }
    if (pending == (bool *)0x0) {
      iVar4 = other->m_length;
LAB_00109ab2:
      local_48._0_8_ = (other->m_string).d.size;
      local_48._8_8_ = (other->m_string).d.ptr;
      QVar5 = QStringView::mid((QStringView *)local_48,(long)other->m_offset,(long)iVar4);
      QString::append((QChar *)this,(longlong)QVar5.m_data);
    }
    else {
      iVar4 = other->m_length;
      if (*pending != false) goto LAB_00109ab2;
      local_48._0_8_ = (other->m_string).d.size;
      local_48._8_8_ = (other->m_string).d.ptr;
      join_0x00000010_0x00000000_ =
           QStringView::mid((QStringView *)local_48,(long)other->m_offset,(long)iVar4);
      local_48[0] = 0x20;
      operator+=(&this->m_string,(QStringBuilder<QLatin1Char,_QStringView> *)local_48);
    }
    this->m_length = (int)(this->m_string).d.size;
    this->m_offset = 0;
    if (other->m_file != 0) {
      this->m_file = other->m_file;
    }
    this->m_hash = 0x80000000;
  }
  if (pending != (bool *)0x0) {
    *pending = true;
  }
LAB_00109b05:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

ProString &ProString::append(const ProString &other, bool *pending)
{
    if (other.m_length) {
        if (!m_length) {
            *this = other;
        } else {
            if (m_length != m_string.size())
                m_string = toQString();
            if (pending && !*pending) {
                m_string += QLatin1Char(' ') + other.toQStringView();
            } else {
                m_string += other.toQStringView();
            }
            m_length = m_string.size();
            m_offset = 0;
            if (other.m_file)
                m_file = other.m_file;
            m_hash = 0x80000000;
        }
        if (pending)
            *pending = true;
    }
    return *this;
}